

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

bool __thiscall
argstest::ArgumentParser::
ParseLong<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (ArgumentParser *this,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *it,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              end)

{
  int iVar1;
  ulong uVar2;
  undefined4 extraout_var;
  bool bVar3;
  string errorMessage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> argchunk;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> joined;
  FlagBase *flag;
  
  std::__cxx11::string::substr((ulong)&argchunk,(ulong)it->_M_current);
  if ((this->longseparator)._M_string_length == 0) {
LAB_00193e75:
    std::__cxx11::string::string((string *)&arg,(string *)&argchunk);
    joined._M_dataplus._M_p = (pointer)&joined.field_2;
    joined._M_string_length = 0;
    joined.field_2._M_local_buf[0] = '\0';
    bVar3 = false;
  }
  else {
    uVar2 = std::__cxx11::string::find((string *)&argchunk,(ulong)&this->longseparator);
    if (uVar2 == 0xffffffffffffffff) goto LAB_00193e75;
    std::__cxx11::string::string((string *)&arg,(string *)&argchunk,0,uVar2);
    bVar3 = true;
    std::__cxx11::string::substr((ulong)&joined,(ulong)&argchunk);
  }
  EitherFlag::EitherFlag((EitherFlag *)&errorMessage,&arg);
  iVar1 = (*(this->super_Command).super_Group.super_Base._vptr_Base[7])(this,&errorMessage);
  flag = (FlagBase *)CONCAT44(extraout_var,iVar1);
  std::__cxx11::string::~string((string *)&errorMessage._M_string_length);
  if (flag == (FlagBase *)0x0) {
    std::operator+(&errorMessage,"Flag could not be matched: ",&arg);
    (this->super_Command).super_Group.super_Base.error = Parse;
    std::__cxx11::string::_M_assign
              ((string *)&(this->super_Command).super_Group.super_Base.errorMsg);
    std::__cxx11::string::~string((string *)&errorMessage);
    bVar3 = false;
    goto LAB_00193fbb;
  }
  values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ParseArgsValues<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&errorMessage,this,flag,&arg,it,end,this->allowSeparateLongValue,
             this->allowJoinedLongValue,bVar3,&joined,false,&values);
  if (errorMessage._M_string_length == 0) {
    if (this->readCompletion == false) {
      (*(flag->super_NamedBase).super_Base._vptr_Base[0x16])(flag,&values);
    }
    bVar3 = true;
    if (((flag->super_NamedBase).super_Base.options & KickOut) != None) {
      it->_M_current = it->_M_current + 1;
      goto LAB_00193fa5;
    }
  }
  else {
    (this->super_Command).super_Group.super_Base.error = Parse;
    std::__cxx11::string::_M_assign
              ((string *)&(this->super_Command).super_Group.super_Base.errorMsg);
LAB_00193fa5:
    bVar3 = false;
  }
  std::__cxx11::string::~string((string *)&errorMessage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&values);
LAB_00193fbb:
  std::__cxx11::string::~string((string *)&joined);
  std::__cxx11::string::~string((string *)&arg);
  std::__cxx11::string::~string((string *)&argchunk);
  return bVar3;
}

Assistant:

bool ParseLong(It &it, It end)
            {
                const auto &chunk = *it;
                const auto argchunk = chunk.substr(longprefix.size());
                // Try to separate it, in case of a separator:
                const auto separator = longseparator.empty() ? argchunk.npos : argchunk.find(longseparator);
                // If the separator is in the argument, separate it.
                const auto arg = (separator != argchunk.npos ?
                    std::string(argchunk, 0, separator)
                    : argchunk);
                const auto joined = (separator != argchunk.npos ?
                    argchunk.substr(separator + longseparator.size())
                    : std::string());

                if (auto flag = Match(arg))
                {
                    std::vector<std::string> values;
                    const std::string errorMessage = ParseArgsValues(*flag, arg, it, end, allowSeparateLongValue, allowJoinedLongValue,
                                                                     separator != argchunk.npos, joined, false, values);
                    if (!errorMessage.empty())
                    {
#ifndef ARGS_NOEXCEPT
                        throw ParseError(errorMessage);
#else
                        error = Error::Parse;
                        errorMsg = errorMessage;
                        return false;
#endif
                    }

                    if (!readCompletion)
                    {
                        flag->ParseValue(values);
                    }

                    if (flag->KickOut())
                    {
                        ++it;
                        return false;
                    }
                } else
                {
                    const std::string errorMessage("Flag could not be matched: " + arg);
#ifndef ARGS_NOEXCEPT
                    throw ParseError(errorMessage);
#else
                    error = Error::Parse;
                    errorMsg = errorMessage;
                    return false;
#endif
                }

                return true;
            }